

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboColorbufferTests.cpp
# Opt level: O0

int __thiscall deqp::gles31::Functional::FboColorTests::init(FboColorTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 texFmt;
  Context *context;
  TestNode *pTVar1;
  ulong extraout_RAX;
  TestNode *node;
  char *name;
  ulong uVar2;
  Vector<int,_3> local_34;
  uint local_28;
  int fmtNdx;
  TestNode *local_18;
  TestCaseGroup *texCubeArrayGroup;
  FboColorTests *this_local;
  
  texCubeArrayGroup = (TestCaseGroup *)this;
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"texcubearray"
             ,"Cube map array texture tests");
  local_18 = pTVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_28 = 0;
  uVar2 = extraout_RAX;
  while (pTVar1 = local_18, (int)local_28 < 0x24) {
    node = (TestNode *)operator_new(0x98);
    context = (this->super_TestCaseGroup).m_context;
    name = FboTestUtil::getFormatName(init::colorFormats[(int)local_28]);
    texFmt = init::colorFormats[(int)local_28];
    tcu::Vector<int,_3>::Vector(&local_34,0x80,0x80,0xc);
    FboColorTexCubeArrayCase::FboColorTexCubeArrayCase
              ((FboColorTexCubeArrayCase *)node,context,name,"",texFmt,&local_34);
    tcu::TestNode::addChild(pTVar1,node);
    local_28 = local_28 + 1;
    uVar2 = (ulong)local_28;
  }
  return (int)uVar2;
}

Assistant:

void FboColorTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA32I,
		GL_RGBA32UI,
		GL_RGBA16I,
		GL_RGBA16UI,
		GL_RGBA8,
		GL_RGBA8I,
		GL_RGBA8UI,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGB10_A2UI,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG32I,
		GL_RG32UI,
		GL_RG16I,
		GL_RG16UI,
		GL_RG8,
		GL_RG8I,
		GL_RG8UI,

		// R formats
		GL_R32I,
		GL_R32UI,
		GL_R16I,
		GL_R16UI,
		GL_R8,
		GL_R8I,
		GL_R8UI,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F,

		// GL_EXT_color_buffer_half_float
		GL_RGB16F
	};

	// .texcubearray
	{
		tcu::TestCaseGroup* texCubeArrayGroup = new tcu::TestCaseGroup(m_testCtx, "texcubearray", "Cube map array texture tests");
		addChild(texCubeArrayGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			texCubeArrayGroup->addChild(new FboColorTexCubeArrayCase(m_context, getFormatName(colorFormats[fmtNdx]), "",
																	 colorFormats[fmtNdx], IVec3(128, 128, 12)));
	}
}